

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

int __thiscall
Imf_2_5::
TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
copy(TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long *plVar1;
  Attribute *attribute;
  
  plVar1 = (long *)operator_new(0x28);
  plVar1[2] = 0;
  plVar1[3] = 0;
  *plVar1 = 0;
  plVar1[1] = 0;
  plVar1[4] = 0;
  TypedAttribute(this);
  (**(code **)(*plVar1 + 0x30))(plVar1,this);
  return (int)plVar1;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}